

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

CBString * __thiscall Bstrlib::CBString::operator+=(CBString *this,char *s)

{
  int *piVar1;
  uchar uVar2;
  int iVar3;
  uchar *puVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  CBStringException *pCVar8;
  ulong uVar9;
  allocator local_79;
  CBStringException bstr__cppwrapper_exception;
  string local_50;
  string local_30;
  
  iVar6 = (this->super_tagbstring).mlen;
  if (iVar6 < 1) {
    std::__cxx11::string::string((string *)&local_30,"CBString::Write protection error",&local_79);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    pCVar8 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar8,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar8,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  iVar3 = (this->super_tagbstring).slen;
  uVar5 = iVar6 - iVar3;
  puVar4 = (this->super_tagbstring).data;
  uVar9 = 0;
  uVar7 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar7 = uVar9;
  }
  while( true ) {
    if ((int)uVar7 == (int)uVar9) {
      piVar1 = &(this->super_tagbstring).slen;
      *piVar1 = *piVar1 + (int)uVar7;
      iVar6 = bcatcstr(&this->super_tagbstring,s + uVar9);
      if (iVar6 != -1) {
        return this;
      }
      std::__cxx11::string::string((string *)&local_50,"CBString::Failure in concatenate",&local_79)
      ;
      CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      pCVar8 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar8,&bstr__cppwrapper_exception);
      __cxa_throw(pCVar8,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    uVar2 = s[uVar9];
    puVar4[uVar9 + (long)iVar3] = uVar2;
    if (uVar2 == '\0') break;
    uVar9 = uVar9 + 1;
  }
  piVar1 = &(this->super_tagbstring).slen;
  *piVar1 = *piVar1 + (int)uVar9;
  return this;
}

Assistant:

const CBString& CBString::operator += (const char *s) {
	char * d;
	int i, l;

	if (mlen <= 0) bstringThrow ("Write protection error");

	/* Optimistically concatenate directly */
	l = mlen - slen;
	d = (char *) &data[slen];
	for (i=0; i < l; i++) {
		if ((*d++ = *s++) == '\0') {
			slen += i;
			return *this;
		}
	}
	slen += i;

	if (BSTR_ERR == bcatcstr (this, s)) {
		bstringThrow ("Failure in concatenate");
	}
	return *this;
}